

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O3

void __thiscall
QPixmapStyle::drawPanelItemViewItem
          (QPixmapStyle *this,QStyleOption *option,QPainter *painter,QWidget *widget)

{
  long lVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  Representation RVar5;
  long in_FS_OFFSET;
  Representation RVar6;
  ControlPixmap cp;
  ControlDescriptor local_bc;
  QRect local_b8;
  QRectF local_a8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  anon_union_24_3_e3d07ef4_for_data local_68;
  double local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8;
  local_a8.h._4_4_ = 0x16;
  local_bc = ID_Selected;
  if (widget != (QWidget *)0x0) {
    QObject::property((char *)local_68.data);
    cVar3 = ::QVariant::toBool();
    ::QVariant::~QVariant((QVariant *)&local_68);
    if (cVar3 != '\0') {
      local_a8.h._4_4_ = 0x15;
      local_bc = DD_ItemSelected;
    }
  }
  local_a8.w = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
            ((QPixmapStylePixmap *)&local_68,
             (QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)(lVar1 + 0xf0),
             (ControlPixmap *)((long)&local_a8.h + 4));
  QPaintDevice::QPaintDevice((QPaintDevice *)&local_a8);
  local_a8.w = (qreal)local_68._16_8_;
  local_a8.xp = (qreal)QDataStream::operator<<;
  local_68._16_8_ = 0;
  QPixmap::~QPixmap((QPixmap *)local_68.data);
  local_b8.x1.m_i = (option->rect).x1.m_i;
  local_b8.y1.m_i = (option->rect).y1.m_i;
  local_b8.x2.m_i = (option->rect).x2.m_i;
  local_b8.y2.m_i = (option->rect).y2.m_i;
  iVar4 = QPixmap::height();
  RVar6.m_i = local_b8.y1.m_i;
  RVar5.m_i = RVar6.m_i + -1 + iVar4;
  local_68._forAlignment = (double)local_b8.x1.m_i;
  local_68._8_8_ = (undefined8)RVar6.m_i;
  local_b8.y2.m_i = RVar5.m_i;
  local_68._16_8_ = (undefined8)(((long)local_b8.x2.m_i - (long)local_b8.x1.m_i) + 1);
  local_50 = (double)(((long)RVar5.m_i - (long)RVar6.m_i) + 1);
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  QPainter::drawPixmap((QRectF *)painter,(QPixmap *)local_68.data,&local_a8);
  if (((option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x8000) != 0) {
    uVar2._0_4_ = (option->rect).x1.m_i;
    uVar2._4_4_ = (option->rect).y1.m_i;
    local_b8.x2.m_i = (option->rect).x2.m_i;
    local_b8.y2.m_i = (option->rect).y2.m_i;
    local_b8._0_8_ = uVar2;
    iVar4 = QPixmap::height();
    local_b8.y1.m_i = iVar4 + uVar2._4_4_;
    drawCachedPixmap(this,local_bc,&local_b8,painter);
  }
  QPixmap::~QPixmap((QPixmap *)&local_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPixmapStyle::drawPanelItemViewItem(const QStyleOption *option, QPainter *painter,
                                         const QWidget *widget) const
{
    Q_D(const QPixmapStyle);

    ControlPixmap cp = ID_Separator;
    ControlDescriptor cd = ID_Selected;

    if (widget && widget->property("_pixmap_combobox_list").toBool()) {
        cp = DD_ItemSeparator;
        cd = DD_ItemSelected;
    }

    QPixmap pix = d->pixmaps.value(cp).pixmap;
    QRect rect = option->rect;
    rect.setBottom(rect.top() + pix.height()-1);
    painter->drawPixmap(rect, pix);
    if (option->state & QStyle::State_Selected) {
        rect = option->rect;
        rect.setTop(rect.top() + pix.height());
        drawCachedPixmap(cd, rect, painter);
    }
}